

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall
S2Polygon::InsertLoop(S2Polygon *this,S2Loop *new_loop,S2Loop *parent,LoopMap *loop_map)

{
  bool bVar1;
  bool bVar2;
  reference ppSVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppSVar6;
  __normal_iterator<S2Loop_**,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_> local_88;
  __normal_iterator<S2Loop_**,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_> local_80;
  const_iterator local_78;
  S2Loop *local_70;
  S2Loop *child_1;
  mapped_type *pmStack_60;
  int i;
  vector<S2Loop_*,_std::allocator<S2Loop_*>_> *new_children;
  S2Loop *child;
  iterator __end2;
  iterator __begin2;
  vector<S2Loop_*,_std::allocator<S2Loop_*>_> *__range2;
  mapped_type *pmStack_30;
  bool done;
  vector<S2Loop_*,_std::allocator<S2Loop_*>_> *children;
  LoopMap *loop_map_local;
  S2Loop *parent_local;
  S2Loop *new_loop_local;
  S2Polygon *this_local;
  
  bVar2 = false;
  loop_map_local = (LoopMap *)parent;
  parent_local = new_loop;
  new_loop_local = (S2Loop *)this;
  do {
    if (bVar2) {
      pmStack_60 = std::
                   map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
                   ::operator[](loop_map,&parent_local);
      child_1._4_4_ = 0;
      while (uVar4 = (ulong)child_1._4_4_,
            sVar5 = std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::size(pmStack_30),
            uVar4 < sVar5) {
        ppSVar6 = std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::operator[]
                            (pmStack_30,(long)child_1._4_4_);
        local_70 = *ppSVar6;
        bVar2 = S2Loop::ContainsNested(parent_local,local_70);
        if (bVar2) {
          std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::push_back(pmStack_60,&local_70);
          local_88._M_current =
               (S2Loop **)std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::begin(pmStack_30);
          local_80 = __gnu_cxx::
                     __normal_iterator<S2Loop_**,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>
                     ::operator+(&local_88,(long)child_1._4_4_);
          __gnu_cxx::__normal_iterator<S2Loop*const*,std::vector<S2Loop*,std::allocator<S2Loop*>>>::
          __normal_iterator<S2Loop**>
                    ((__normal_iterator<S2Loop*const*,std::vector<S2Loop*,std::allocator<S2Loop*>>>
                      *)&local_78,&local_80);
          std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::erase(pmStack_30,local_78);
        }
        else {
          child_1._4_4_ = child_1._4_4_ + 1;
        }
      }
      std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::push_back(pmStack_30,&parent_local);
      return;
    }
    pmStack_30 = std::
                 map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
                 ::operator[](loop_map,(key_type *)&loop_map_local);
    bVar2 = true;
    __end2 = std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::begin(pmStack_30);
    child = (S2Loop *)std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>::end(pmStack_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<S2Loop_**,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>
                                       *)&child), bVar1) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<S2Loop_**,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>::
                operator*(&__end2);
      new_children = (vector<S2Loop_*,_std::allocator<S2Loop_*>_> *)*ppSVar3;
      bVar1 = S2Loop::ContainsNested((S2Loop *)new_children,parent_local);
      if (bVar1) {
        loop_map_local = (LoopMap *)new_children;
        bVar2 = false;
        break;
      }
      __gnu_cxx::__normal_iterator<S2Loop_**,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>::
      operator++(&__end2);
    }
  } while( true );
}

Assistant:

void S2Polygon::InsertLoop(S2Loop* new_loop, S2Loop* parent,
                           LoopMap* loop_map) {
  vector<S2Loop*>* children;
  for (bool done = false; !done; ) {
    children = &(*loop_map)[parent];
    done = true;
    for (S2Loop* child : *children) {
      if (child->ContainsNested(new_loop)) {
        parent = child;
        done = false;
        break;
      }
    }
  }

  // Some of the children of the parent loop may now be children of
  // the new loop.
  vector<S2Loop*>* new_children = &(*loop_map)[new_loop];
  for (int i = 0; i < children->size();) {
    S2Loop* child = (*children)[i];
    if (new_loop->ContainsNested(child)) {
      new_children->push_back(child);
      children->erase(children->begin() + i);
    } else {
      ++i;
    }
  }
  children->push_back(new_loop);
}